

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceGLImpl.cpp
# Opt level: O3

Uint64 __thiscall Diligent::FenceGLImpl::GetCompletedValue(FenceGLImpl *this)

{
  atomic<unsigned_long> *paVar1;
  ulong uVar2;
  GLenum GVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  value_type *val_fence;
  _Elt_pointer ppVar7;
  bool bVar8;
  
  ppVar7 = (this->m_PendingFences).
           super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->m_PendingFences).
      super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar7) {
    do {
      GVar3 = (*__glewClientWaitSync)((ppVar7->second).SyncHandle,0,0);
      if (GVar3 != 0x911a) break;
      uVar2 = ppVar7->first;
      uVar4 = (this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue.
              super___atomic_base<unsigned_long>._M_i;
      do {
        uVar6 = uVar2;
        if (uVar2 < uVar4) {
          uVar6 = uVar4;
        }
        paVar1 = &(this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue;
        LOCK();
        uVar5 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
        bVar8 = uVar4 == uVar5;
        if (bVar8) {
          (paVar1->super___atomic_base<unsigned_long>)._M_i = uVar6;
          uVar5 = uVar4;
        }
        UNLOCK();
        uVar4 = uVar5;
      } while (!bVar8);
      std::
      deque<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
      ::pop_front(&this->m_PendingFences);
      ppVar7 = (this->m_PendingFences).
               super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
    } while ((this->m_PendingFences).
             super__Deque_base<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>,_std::allocator<std::pair<unsigned_long,_GLObjectWrappers::GLSyncObj>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppVar7);
  }
  return (this->super_FenceBase<Diligent::EngineGLImplTraits>).m_LastCompletedFenceValue.
         super___atomic_base<unsigned_long>._M_i;
}

Assistant:

Uint64 FenceGLImpl::GetCompletedValue()
{
    while (!m_PendingFences.empty())
    {
        auto& val_fence = m_PendingFences.front();

        auto res =
            glClientWaitSync(val_fence.second,
                             0, // Can be SYNC_FLUSH_COMMANDS_BIT
                             0  // Timeout in nanoseconds
            );
        if (res == GL_ALREADY_SIGNALED)
        {
            UpdateLastCompletedFenceValue(val_fence.first);
            m_PendingFences.pop_front();
        }
        else
        {
            break;
        }
    }

    return m_LastCompletedFenceValue.load();
}